

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::GenerateCommonBuilderMethods
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,this->descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  super(DEFAULT_INSTANCE);\n}\n\n"
             ,(char (*) [10])0x77c586,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "  super(DEFAULT_INSTANCE);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
}